

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O0

complex_t __thiscall Iir::Cascade::response(Cascade *this,double normalizedFrequency)

{
  complex<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  complex<double> *this_00;
  complex<double> *extraout_XMM0_Qa;
  complex<double> *pcVar2;
  double extraout_XMM0_Qa_00;
  undefined8 uVar3;
  complex<double> cVar4;
  complex_t ct;
  complex_t cb;
  int i;
  Biquad *stage;
  complex_t cbot;
  complex_t ch;
  complex_t czn2;
  complex_t czn1;
  double w;
  complex<double> *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  double in_stack_ffffffffffffff08;
  complex<double> *in_stack_ffffffffffffff10;
  complex<double> *__z;
  undefined1 local_b8 [16];
  undefined1 local_a8 [20];
  int local_94;
  Biquad *local_90;
  complex<double> local_88;
  complex<double> local_78;
  double local_68;
  undefined8 local_60;
  undefined8 local_50;
  double local_48;
  undefined8 local_40;
  undefined8 local_30;
  double local_28;
  double local_20;
  
  uVar3 = 0x3fe0000000000000;
  local_20 = in_XMM0_Qa;
  if (0.5 < in_XMM0_Qa) {
    throw_invalid_argument((char *)in_stack_fffffffffffffef0);
  }
  if (local_20 < 0.0) {
    throw_invalid_argument((char *)in_stack_fffffffffffffef0);
  }
  local_28 = local_20 * 6.283185307179586;
  local_40 = 0x3ff0000000000000;
  local_48 = -local_28;
  std::polar<double>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_60 = 0x3ff0000000000000;
  local_68 = local_28 * -2.0;
  local_30 = uVar3;
  std::polar<double>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_50 = uVar3;
  std::complex<double>::complex(&local_78,1.0,0.0);
  std::complex<double>::complex(&local_88,1.0,0.0);
  local_90 = *(Biquad **)(in_RDI->_M_value + 8);
  local_94 = *(int *)in_RDI->_M_value;
  while (local_94 = local_94 + -1, -1 < local_94) {
    std::complex<double>::complex((complex<double> *)local_a8,1.0,0.0);
    in_stack_fffffffffffffed8 = (complex<double> *)Biquad::getB0(local_90);
    dVar1 = Biquad::getA0(local_90);
    std::complex<double>::complex
              ((complex<double> *)local_b8,(double)in_stack_fffffffffffffed8 / dVar1,0.0);
    Biquad::getB1(local_90);
    dVar1 = Biquad::getA0(local_90);
    addmul<double,double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    local_b8._8_8_ = dVar1;
    Biquad::getB2(local_90);
    this_00 = (complex<double> *)Biquad::getA0(local_90);
    addmul<double,double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    __z = extraout_XMM0_Qa;
    local_b8._8_8_ = this_00;
    Biquad::getA1(local_90);
    dVar1 = Biquad::getA0(local_90);
    addmul<double,double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    local_a8._8_8_ = dVar1;
    Biquad::getA2(local_90);
    pcVar2 = (complex<double> *)Biquad::getA0(local_90);
    addmul<double,double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    in_stack_ffffffffffffff08 = extraout_XMM0_Qa_00;
    local_a8._8_8_ = pcVar2;
    std::complex<double>::operator*=(this_00,__z);
    std::complex<double>::operator*=(this_00,__z);
    local_90 = local_90 + 1;
    in_stack_ffffffffffffff10 = pcVar2;
  }
  cVar4 = std::operator/(in_stack_fffffffffffffed8,(complex<double> *)0x1042d6);
  return (complex_t)cVar4._M_value;
}

Assistant:

complex_t Cascade::response (double normalizedFrequency) const
	{
		if (normalizedFrequency > 0.5) throw_invalid_argument(maxFError);
		if (normalizedFrequency < 0.0) throw_invalid_argument(minFError);
		double w = 2 * doublePi * normalizedFrequency;
		const complex_t czn1 = std::polar (1., -w);
		const complex_t czn2 = std::polar (1., -2 * w);
		complex_t ch (1);
		complex_t cbot (1);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0; ++stage)
		{
			complex_t cb (1);
			complex_t ct    (stage->getB0()/stage->getA0());
			ct = addmul (ct, stage->getB1()/stage->getA0(), czn1);
			ct = addmul (ct, stage->getB2()/stage->getA0(), czn2);
			cb = addmul (cb, stage->getA1()/stage->getA0(), czn1);
			cb = addmul (cb, stage->getA2()/stage->getA0(), czn2);
			ch   *= ct;
			cbot *= cb;
		}

		return ch / cbot;
	}